

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

_Bool Curl_pipeline_server_blacklisted(SessionHandle *handle,char *server_name)

{
  char *__s;
  int iVar1;
  curl_llist *pcVar2;
  size_t max;
  char *bl_server_name;
  curl_llist_element *curr;
  curl_llist *blacklist;
  char *server_name_local;
  SessionHandle *handle_local;
  
  if (handle->multi != (Curl_multi *)0x0) {
    pcVar2 = Curl_multi_pipelining_server_bl(handle->multi);
    if (pcVar2 != (curl_llist *)0x0) {
      for (bl_server_name = (char *)pcVar2->head; bl_server_name != (char *)0x0;
          bl_server_name = *(char **)(bl_server_name + 0x10)) {
        __s = *(char **)bl_server_name;
        max = strlen(__s);
        iVar1 = Curl_raw_nequal(__s,server_name,max);
        if (iVar1 != 0) {
          Curl_infof(handle,"Server %s is blacklisted\n",server_name);
          return true;
        }
      }
    }
    Curl_infof(handle,"Server %s is not blacklisted\n",server_name);
  }
  return false;
}

Assistant:

bool Curl_pipeline_server_blacklisted(struct SessionHandle *handle,
                                      char *server_name)
{
  if(handle->multi) {
    struct curl_llist *blacklist =
      Curl_multi_pipelining_server_bl(handle->multi);

    if(blacklist) {
      struct curl_llist_element *curr;

      curr = blacklist->head;
      while(curr) {
        char *bl_server_name;

        bl_server_name = curr->ptr;
        if(Curl_raw_nequal(bl_server_name, server_name,
                           strlen(bl_server_name))) {
          infof(handle, "Server %s is blacklisted\n", server_name);
          return TRUE;
        }
        curr = curr->next;
      }
    }

    infof(handle, "Server %s is not blacklisted\n", server_name);
  }
  return FALSE;
}